

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duel.h
# Opt level: O0

void __thiscall duel::duel(duel *this,card *cards)

{
  bool bVar1;
  uint uVar2;
  uint *puVar3;
  ostream *poVar4;
  uint uVar5;
  card *cards_local;
  duel *this_local;
  
  this->totalCards = 0x2c;
  std::stack<card,std::deque<card,std::allocator<card>>>::
  stack<std::deque<card,std::allocator<card>>,void>
            ((stack<card,std::deque<card,std::allocator<card>>> *)&this->deck);
  field::field(&this->field1);
  field::field(&this->field2);
  hand::hand(&this->hand1);
  hand::hand(&this->hand2);
  this->player = 1;
  this->duelEnd = false;
  while (bVar1 = std::stack<card,_std::deque<card,_std::allocator<card>_>_>::empty(&this->deck),
        ((bVar1 ^ 0xffU) & 1) != 0) {
    std::stack<card,_std::deque<card,_std::allocator<card>_>_>::pop(&this->deck);
  }
  createDeck(this,cards);
  initializeHands(this);
  initializeField(this);
  puVar3 = field::getPile(&this->field1);
  uVar2 = *puVar3;
  puVar3 = field::getPile(&this->field2);
  uVar5 = 2;
  if (uVar2 < *puVar3) {
    uVar5 = 1;
  }
  this->player = uVar5;
  while (((this->duelEnd ^ 0xffU) & 1) != 0) {
    poVar4 = std::operator<<((ostream *)&std::cout,"player ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,this->player);
    std::operator<<(poVar4,"\'s turn.");
    system("pause");
    printField(this);
    if (this->player == 1) {
      uVar2 = hand::getRegularCards(&this->hand1);
      if (uVar2 == 0) {
        this->duelEnd = true;
      }
      else {
        uVar2 = pickCard(this,&this->hand1,false);
        playCard(this,&this->hand1,&this->hand2,&this->field1,&this->field2,uVar2);
        puVar3 = field::getPile(&this->field2);
        uVar2 = *puVar3;
        puVar3 = field::getPile(&this->field1);
        if (*puVar3 < uVar2) {
          this->duelEnd = true;
        }
        this->player = 2;
      }
    }
    else {
      uVar2 = hand::getRegularCards(&this->hand2);
      if (uVar2 == 0) {
        this->duelEnd = true;
      }
      else {
        uVar2 = pickCard(this,&this->hand2,false);
        playCard(this,&this->hand2,&this->hand1,&this->field2,&this->field1,uVar2);
        puVar3 = field::getPile(&this->field1);
        uVar2 = *puVar3;
        puVar3 = field::getPile(&this->field2);
        if (*puVar3 < uVar2) {
          this->duelEnd = true;
        }
        this->player = 1;
      }
    }
    bVar1 = equalValue(this);
    if (bVar1) {
      resetField(this);
      initializeField(this);
      puVar3 = field::getPile(&this->field1);
      uVar2 = *puVar3;
      puVar3 = field::getPile(&this->field2);
      uVar5 = 2;
      if (uVar2 < *puVar3) {
        uVar5 = 1;
      }
      this->player = uVar5;
    }
  }
  checkEnd(this);
  return;
}

Assistant:

duel::duel(card cards[]) {
    player = 1;
    duelEnd = false;
    while(!deck.empty()) deck.pop();
    createDeck(cards);
    initializeHands();
    // sets up field by drawing until tie is gone
    initializeField();
    // player 1 goes first if pile is less than player 2, else player 2's turn
    player = (field1.getPile() < field2.getPile()) ? 1 : 2;
    while(!duelEnd) {
        cout << "player " << player << "'s turn.";
        system("pause");
        printField();
        if(player == 1) {
            // check if hand only has special cards
            if(hand1.getRegularCards() == 0) duelEnd = true;
            else {
                playCard(hand1,hand2,field1,field2,pickCard(hand1,false));
                // check if lost
                if (field2.getPile() > field1.getPile()) duelEnd = true;
                player = 2;
            }
        }
        else {
            // check if hand only has special cards
            if(hand2.getRegularCards() == 0) duelEnd = true;
            else {
                playCard(hand2,hand1,field2,field1,pickCard(hand2,false));
                // check if lost
                if (field1.getPile() > field2.getPile()) duelEnd = true;
                player = 1;
            }
        }
        if (equalValue()) {
            resetField();
            initializeField();
            player = (field1.getPile() < field2.getPile()) ? 1 : 2;
        }
    }
    checkEnd();
}